

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O1

int check_acl(mg_context *phys_ctx,usa *sa)

{
  char cVar1;
  int iVar2;
  char *list;
  size_t sVar3;
  char *extraout_RDX;
  char *pcVar4;
  int iVar5;
  bool bVar6;
  vec vec;
  vec local_40;
  
  pcVar4 = (phys_ctx->dd).config[0x25];
  bVar6 = pcVar4 == (char *)0x0;
  list = next_option(pcVar4,&local_40,(vec *)0x0);
  if (list != (char *)0x0) {
    iVar5 = (uint)(pcVar4 != (char *)0x0) * 2 + 0x2b;
    do {
      cVar1 = *local_40.ptr;
      iVar2 = -1;
      sVar3 = local_40.len;
      pcVar4 = local_40.ptr;
      if ((local_40.len != 0) && ((cVar1 == '-' || (cVar1 == '+')))) {
        local_40.ptr = local_40.ptr + 1;
        sVar3 = local_40.len - 1;
        local_40.len = sVar3;
        iVar2 = parse_match_net(&local_40,sa,1);
        pcVar4 = extraout_RDX;
      }
      if (iVar2 < 0) {
        mg_cry_internal_wrap
                  ((mg_connection *)0x0,phys_ctx,pcVar4,(uint)sVar3,
                   "%s: subnet must be [+|-]IP-addr[/x]","check_acl");
        return -1;
      }
      if (iVar2 != 0) {
        iVar5 = (int)cVar1;
      }
      list = next_option(list,&local_40,(vec *)0x0);
    } while (list != (char *)0x0);
    bVar6 = iVar5 == 0x2b;
  }
  return (uint)bVar6;
}

Assistant:

static int
check_acl(struct mg_context *phys_ctx, const union usa *sa)
{
	int allowed, flag, matched;
	struct vec vec;

	if (phys_ctx) {
		const char *list = phys_ctx->dd.config[ACCESS_CONTROL_LIST];

		/* If any ACL is set, deny by default */
		allowed = (list == NULL) ? '+' : '-';

		while ((list = next_option(list, &vec, NULL)) != NULL) {
			flag = vec.ptr[0];
			matched = -1;
			if ((vec.len > 0) && ((flag == '+') || (flag == '-'))) {
				vec.ptr++;
				vec.len--;
				matched = parse_match_net(&vec, sa, 1);
			}
			if (matched < 0) {
				mg_cry_ctx_internal(phys_ctx,
				                    "%s: subnet must be [+|-]IP-addr[/x]",
				                    __func__);
				return -1;
			}
			if (matched) {
				allowed = flag;
			}
		}

		return allowed == '+';
	}
	return -1;
}